

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall
CLI::App::_parse_positional
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool haltOnSubcommand)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer puVar3;
  _Head_base<0UL,_CLI::Option_*,_false> _Var4;
  pointer psVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  size_type sVar7;
  bool bVar8;
  size_t sVar9;
  App *pAVar10;
  ExtrasError *this_00;
  undefined7 in_register_00000011;
  pointer psVar11;
  pointer puVar12;
  _Head_base<0UL,_CLI::Option_*,_false> local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e0;
  pointer local_d8;
  undefined4 local_cc;
  string pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  local_cc = (undefined4)CONCAT71(in_register_00000011,haltOnSubcommand);
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_d8 = pbVar1 + -1;
  local_e0 = args;
  if ((this->positionals_at_end_ == true) &&
     (pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     sVar9 = _count_remaining_positionals(this,true),
     (ulong)((long)pbVar1 - (long)pbVar2 >> 5) <= sVar9)) {
    puVar3 = (this->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar12 = (this->options_).
                   super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar3;
        puVar12 = puVar12 + 1) {
      _Var4._M_head_impl =
           (puVar12->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if (((((_Var4._M_head_impl)->pname_)._M_string_length != 0) &&
          (((_Var4._M_head_impl)->super_OptionBase<CLI::Option>).required_ == true)) &&
         ((int)((ulong)((long)*(pointer *)
                               ((long)&((_Var4._M_head_impl)->results_).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               + 8) -
                       *(long *)&((_Var4._M_head_impl)->results_).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data) >> 5) <
          (_Var4._M_head_impl)->expected_min_ * (_Var4._M_head_impl)->type_size_min_)) {
        if (this->validate_positionals_ == false) goto LAB_001853a5;
        ::std::__cxx11::string::string((string *)&pos,local_d8);
        Option::_validate(&local_50,
                          (puVar12->_M_t).
                          super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t
                          .super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                          super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&pos,0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&pos,&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
        sVar7 = pos._M_string_length;
        ::std::__cxx11::string::~string((string *)&pos);
        if (sVar7 == 0) {
          _Var4._M_head_impl =
               (puVar12->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
               ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          if (_Var4._M_head_impl != (Option *)0x0) goto LAB_001853a5;
          local_e8._M_head_impl = (Option *)0x0;
          break;
        }
      }
    }
  }
  puVar12 = (this->options_).
            super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar12 == puVar3) {
LAB_0018543d:
      pvVar6 = local_e0;
      psVar5 = (this->subcommands_).
               super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar11 = (this->subcommands_).
                     super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar5;
          psVar11 = psVar11 + 1) {
        pAVar10 = (psVar11->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if ((((pAVar10->name_)._M_string_length == 0) && (pAVar10->disabled_ == false)) &&
           (bVar8 = _parse_positional(pAVar10,pvVar6,false), bVar8)) {
          pAVar10 = (psVar11->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if (pAVar10->pre_parse_called_ == false) {
            _trigger_pre_parse(pAVar10,(long)(pvVar6->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(pvVar6->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start >> 5);
            return true;
          }
          return true;
        }
      }
      if ((this->parent_ != (App *)0x0) && (this->fallthrough_ == true)) {
        pAVar10 = _get_fallthrough_parent(this);
        bVar8 = _parse_positional(pAVar10,pvVar6,
                                  (this->parse_complete_callback_).super__Function_base._M_manager
                                  != (_Manager_type)0x0);
        return bVar8;
      }
      pAVar10 = _find_subcommand(this,(pvVar6->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish + -1,true,false);
      if ((pAVar10 == (App *)0x0) ||
         ((this->require_subcommand_max_ != 0 &&
          (this->require_subcommand_max_ <=
           (ulong)((long)(this->parsed_subcommands_).
                         super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->parsed_subcommands_).
                         super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3))))) {
        pAVar10 = this;
        if (this->parent_ != (App *)0x0) {
          pAVar10 = _get_fallthrough_parent(this);
        }
        pAVar10 = _find_subcommand(pAVar10,(pvVar6->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish + -1,true,
                                   false);
        if (pAVar10 != (App *)0x0) {
          pAVar10 = pAVar10->parent_;
          if (pAVar10->require_subcommand_max_ == 0) {
            return false;
          }
          if ((ulong)((long)(pAVar10->parsed_subcommands_).
                            super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(pAVar10->parsed_subcommands_).
                            super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) <
              pAVar10->require_subcommand_max_) {
            return false;
          }
        }
        if (this->positionals_at_end_ == true) {
          this_00 = (ExtrasError *)__cxa_allocate_exception(0x38);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_a8,pvVar6);
          ExtrasError::ExtrasError(this_00,&this->name_,&local_a8);
          __cxa_throw(this_00,&ExtrasError::typeinfo,Error::~Error);
        }
        if ((this->parent_ == (App *)0x0) || ((this->name_)._M_string_length != 0)) {
          _move_to_missing(this,NONE,local_d8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(pvVar6);
          if (this->prefix_command_ == true) {
            while (pbVar1 = (pvVar6->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish,
                  (pvVar6->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start != pbVar1) {
              _move_to_missing(this,NONE,pbVar1 + -1);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_back(pvVar6);
            }
            return true;
          }
          return true;
        }
      }
      else if ((char)local_cc == '\0') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(pvVar6);
        _parse(pAVar10,pvVar6);
        return true;
      }
      return false;
    }
    _Var4._M_head_impl =
         (puVar12->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if ((((_Var4._M_head_impl)->pname_)._M_string_length != 0) &&
       (((int)((ulong)((long)*(pointer *)
                              ((long)&((_Var4._M_head_impl)->results_).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              + 8) -
                      *(long *)&((_Var4._M_head_impl)->results_).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl) >> 5) <
         (_Var4._M_head_impl)->expected_min_ * (_Var4._M_head_impl)->type_size_min_ ||
        ((_Var4._M_head_impl)->allow_extra_args_ == true)))) {
      if (this->validate_positionals_ == false) goto LAB_001853a5;
      ::std::__cxx11::string::string((string *)&pos,local_d8);
      Option::_validate(&local_50,
                        (puVar12->_M_t).
                        super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                        super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                        super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&pos,0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&pos,&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      sVar7 = pos._M_string_length;
      ::std::__cxx11::string::~string((string *)&pos);
      if (sVar7 == 0) {
        local_e8._M_head_impl =
             (puVar12->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
             _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        _Var4._M_head_impl = local_e8._M_head_impl;
        if (local_e8._M_head_impl != (Option *)0x0) {
LAB_001853a5:
          local_e8._M_head_impl = _Var4._M_head_impl;
          std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                    (&this->parse_order_,&local_e8._M_head_impl);
          if ((((local_e8._M_head_impl)->inject_separator_ == true) &&
              (pbVar1 = ((local_e8._M_head_impl)->results_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
              ((local_e8._M_head_impl)->results_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != pbVar1)) &&
             (pbVar1[-1]._M_string_length != 0)) {
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            local_90._M_string_length = 0;
            local_90.field_2._M_local_buf[0] = '\0';
            Option::add_result(local_e8._M_head_impl,&local_90);
            ::std::__cxx11::string::~string((string *)&local_90);
          }
          pvVar6 = local_e0;
          if (((local_e8._M_head_impl)->trigger_on_result_ == true) &&
             ((local_e8._M_head_impl)->current_option_state_ == callback_run)) {
            Option::clear(local_e8._M_head_impl);
          }
          _Var4._M_head_impl = local_e8._M_head_impl;
          ::std::__cxx11::string::string((string *)&local_70,local_d8);
          Option::add_result(_Var4._M_head_impl,&local_70);
          ::std::__cxx11::string::~string((string *)&local_70);
          if ((local_e8._M_head_impl)->trigger_on_result_ == true) {
            Option::run_callback(local_e8._M_head_impl);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(pvVar6);
          return true;
        }
        goto LAB_0018543d;
      }
    }
    puVar12 = puVar12 + 1;
  } while( true );
}

Assistant:

CLI11_INLINE bool App::_parse_positional(std::vector<std::string> &args, bool haltOnSubcommand) {

    const std::string &positional = args.back();
    Option *posOpt{nullptr};

    if(positionals_at_end_) {
        // deal with the case of required arguments at the end which should take precedence over other arguments
        auto arg_rem = args.size();
        auto remreq = _count_remaining_positionals(true);
        if(arg_rem <= remreq) {
            for(const Option_p &opt : options_) {
                if(opt->get_positional() && opt->required_) {
                    if(static_cast<int>(opt->count()) < opt->get_items_expected_min()) {
                        if(validate_positionals_) {
                            std::string pos = positional;
                            pos = opt->_validate(pos, 0);
                            if(!pos.empty()) {
                                continue;
                            }
                        }
                        posOpt = opt.get();
                        break;
                    }
                }
            }
        }
    }
    if(posOpt == nullptr) {
        for(const Option_p &opt : options_) {
            // Eat options, one by one, until done
            if(opt->get_positional() &&
               (static_cast<int>(opt->count()) < opt->get_items_expected_min() || opt->get_allow_extra_args())) {
                if(validate_positionals_) {
                    std::string pos = positional;
                    pos = opt->_validate(pos, 0);
                    if(!pos.empty()) {
                        continue;
                    }
                }
                posOpt = opt.get();
                break;
            }
        }
    }
    if(posOpt != nullptr) {
        parse_order_.push_back(posOpt);
        if(posOpt->get_inject_separator()) {
            if(!posOpt->results().empty() && !posOpt->results().back().empty()) {
                posOpt->add_result(std::string{});
            }
        }
        if(posOpt->get_trigger_on_parse() && posOpt->current_option_state_ == Option::option_state::callback_run) {
            posOpt->clear();
        }
        posOpt->add_result(positional);
        if(posOpt->get_trigger_on_parse()) {
            posOpt->run_callback();
        }

        args.pop_back();
        return true;
    }

    for(auto &subc : subcommands_) {
        if((subc->name_.empty()) && (!subc->disabled_)) {
            if(subc->_parse_positional(args, false)) {
                if(!subc->pre_parse_called_) {
                    subc->_trigger_pre_parse(args.size());
                }
                return true;
            }
        }
    }
    // let the parent deal with it if possible
    if(parent_ != nullptr && fallthrough_)
        return _get_fallthrough_parent()->_parse_positional(args, static_cast<bool>(parse_complete_callback_));

    /// Try to find a local subcommand that is repeated
    auto *com = _find_subcommand(args.back(), true, false);
    if(com != nullptr && (require_subcommand_max_ == 0 || require_subcommand_max_ > parsed_subcommands_.size())) {
        if(haltOnSubcommand) {
            return false;
        }
        args.pop_back();
        com->_parse(args);
        return true;
    }
    /// now try one last gasp at subcommands that have been executed before, go to root app and try to find a
    /// subcommand in a broader way, if one exists let the parent deal with it
    auto *parent_app = (parent_ != nullptr) ? _get_fallthrough_parent() : this;
    com = parent_app->_find_subcommand(args.back(), true, false);
    if(com != nullptr && (com->parent_->require_subcommand_max_ == 0 ||
                          com->parent_->require_subcommand_max_ > com->parent_->parsed_subcommands_.size())) {
        return false;
    }

    if(positionals_at_end_) {
        throw CLI::ExtrasError(name_, args);
    }
    /// If this is an option group don't deal with it
    if(parent_ != nullptr && name_.empty()) {
        return false;
    }
    /// We are out of other options this goes to missing
    _move_to_missing(detail::Classifier::NONE, positional);
    args.pop_back();
    if(prefix_command_) {
        while(!args.empty()) {
            _move_to_missing(detail::Classifier::NONE, args.back());
            args.pop_back();
        }
    }

    return true;
}